

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void * nn_reallocmsg(void *msg,size_t size)

{
  int iVar1;
  int *piVar2;
  int rc;
  size_t size_local;
  void *msg_local;
  
  size_local = (size_t)msg;
  iVar1 = nn_chunk_realloc(size,(void **)&size_local);
  if (iVar1 == 0) {
    msg_local = (void *)size_local;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    msg_local = (void *)0x0;
  }
  return msg_local;
}

Assistant:

void *nn_reallocmsg (void *msg, size_t size)
{
    int rc;

    rc = nn_chunk_realloc (size, &msg);
    if (rc == 0)
        return msg;
    errno = -rc;
    return NULL;
}